

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmidiin.cpp
# Opt level: O3

bool chooseMidiPort(RtMidiIn *rtmidi)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  ostream *poVar4;
  uint uVar5;
  string portName;
  string keyHit;
  bool local_95;
  long *local_90;
  long local_88;
  long local_80 [2];
  char *local_70;
  long local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nWould you like to open a virtual input port? [y/N] ",0x34);
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -8);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_50,cVar1);
  iVar2 = std::__cxx11::string::compare((char *)&local_50);
  if (iVar2 == 0) {
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"RtMidi Input","");
    (**(code **)(*(long *)rtmidi + 8))(rtmidi,&local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    local_95 = true;
  }
  else {
    local_70 = &local_60;
    local_68 = 0;
    local_60 = '\0';
    uVar3 = (**(code **)(*(long *)rtmidi + 0x10))(rtmidi);
    local_95 = uVar3 != 0;
    if (uVar3 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"No input ports available!",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
      std::ostream::put(-0x70);
      std::ostream::flush();
    }
    else {
      if (uVar3 == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nOpening ",9);
        (**(code **)(*(long *)rtmidi + 0x18))(&local_90,rtmidi,0);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_90,local_88);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        if (local_90 != local_80) {
          operator_delete(local_90,local_80[0] + 1);
        }
        uVar5 = 0;
      }
      else {
        uVar5 = 0;
        do {
          (**(code **)(*(long *)rtmidi + 0x18))((string *)&local_90,rtmidi,uVar5);
          std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
          if (local_90 != local_80) {
            operator_delete(local_90,local_80[0] + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  Input port #",0xe);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_70,local_68);
          local_90 = (long *)CONCAT71(local_90._1_7_,10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_90,1);
          uVar5 = uVar5 + 1;
        } while (uVar5 < uVar3);
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\nChoose a port number: ",0x17);
          std::istream::_M_extract<unsigned_int>((uint *)&std::cin);
        } while (uVar3 <= uVar5);
        cVar1 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + -8);
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&std::cin,(string *)&local_50,cVar1);
      }
      local_90 = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"RtMidi Input","");
      (*(code *)**(undefined8 **)rtmidi)(rtmidi,uVar5,&local_90);
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  return local_95;
}

Assistant:

bool chooseMidiPort( RtMidiIn *rtmidi )
{
  std::cout << "\nWould you like to open a virtual input port? [y/N] ";

  std::string keyHit;
  std::getline( std::cin, keyHit );
  if ( keyHit == "y" ) {
    rtmidi->openVirtualPort();
    return true;
  }

  std::string portName;
  unsigned int i = 0, nPorts = rtmidi->getPortCount();
  if ( nPorts == 0 ) {
    std::cout << "No input ports available!" << std::endl;
    return false;
  }

  if ( nPorts == 1 ) {
    std::cout << "\nOpening " << rtmidi->getPortName() << std::endl;
  }
  else {
    for ( i=0; i<nPorts; i++ ) {
      portName = rtmidi->getPortName(i);
      std::cout << "  Input port #" << i << ": " << portName << '\n';
    }

    do {
      std::cout << "\nChoose a port number: ";
      std::cin >> i;
    } while ( i >= nPorts );
    std::getline( std::cin, keyHit );  // used to clear out stdin
  }

  rtmidi->openPort( i );

  return true;
}